

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall
pugi::xml_node::insert_child_before(xml_node *this,xml_node_type type_,xml_node *node)

{
  ulong uVar1;
  xml_allocator *this_00;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *pxVar4;
  xml_node_struct *pxVar5;
  xml_node_struct **ppxVar6;
  uint uVar7;
  xml_node n;
  xml_node local_20;
  
  pxVar5 = this->_root;
  if (pxVar5 != (xml_node_struct *)0x0) {
    if (type_ < node_element) {
      return (xml_node)(xml_node_struct *)0x0;
    }
    uVar7 = (uint)pxVar5->header & 0xf;
    if (uVar7 - 3 < 0xfffffffe) {
      return (xml_node)(xml_node_struct *)0x0;
    }
    if (((type_ + ~node_doctype < 0xfffffffe || uVar7 == 1) &&
        (node->_root != (xml_node_struct *)0x0)) && (node->_root->parent == pxVar5)) {
      this_00 = *(xml_allocator **)((long)pxVar5 - (pxVar5->header >> 8));
      uVar1 = this_00->_busy_size + 0x40;
      if (uVar1 < 0x7fd9) {
        local_20._root = (xml_node_struct *)this_00->_root;
        pxVar5 = (xml_node_struct *)((long)&(local_20._root)->prev_sibling_c + this_00->_busy_size);
        this_00->_busy_size = uVar1;
      }
      else {
        pxVar5 = (xml_node_struct *)
                 impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                           (this_00,0x40,(xml_memory_page **)&local_20);
        if (pxVar5 == (xml_node_struct *)0x0) {
          return (xml_node)(xml_node_struct *)0x0;
        }
      }
      pxVar5->prev_sibling_c = (xml_node_struct *)0x0;
      pxVar5->next_sibling = (xml_node_struct *)0x0;
      pxVar5->parent = (xml_node_struct *)0x0;
      pxVar5->first_child = (xml_node_struct *)0x0;
      pxVar5->name = (char_t *)0x0;
      pxVar5->value = (char_t *)0x0;
      pxVar5->first_attribute = (xml_attribute_struct *)0x0;
      pxVar5->header = (ulong)type_ | ((long)pxVar5 - (long)local_20._root) * 0x100;
      pxVar2 = node->_root;
      pxVar3 = pxVar2->parent;
      pxVar5->parent = pxVar3;
      pxVar4 = pxVar2->prev_sibling_c;
      ppxVar6 = &pxVar3->first_child;
      if (pxVar4->next_sibling != (xml_node_struct *)0x0) {
        ppxVar6 = &pxVar4->next_sibling;
      }
      *ppxVar6 = pxVar5;
      pxVar5->prev_sibling_c = pxVar4;
      pxVar5->next_sibling = pxVar2;
      pxVar2->prev_sibling_c = pxVar5;
      if (type_ == node_declaration) {
        local_20._root = pxVar5;
        set_name(&local_20,"xml");
        return (xml_node)pxVar5;
      }
      return (xml_node)pxVar5;
    }
  }
  return (xml_node)(xml_node_struct *)0x0;
}

Assistant:

PUGI__FN xml_node_type xml_node::type() const
	{
		return _root ? PUGI__NODETYPE(_root) : node_null;
	}